

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::Accumulate(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t *outY,
                    uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  byte *pbVar6;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  uint in_EDI;
  uint in_R8D;
  uint in_R9D;
  uint32_t *outX;
  uint8_t *imageX;
  simd data_4;
  simd data_3;
  simd data_2;
  simd data_1;
  simd dataHi;
  simd dataLo;
  simd data;
  simd *dst;
  simd *srcEnd;
  simd *src;
  uint32_t width;
  simd zero;
  int *local_578;
  byte *local_568;
  undefined1 (*local_480) [32];
  undefined1 (*local_470) [32];
  undefined1 (*local_428) [32];
  undefined1 (*local_418) [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  
  local_428 = in_RCX;
  for (local_418 = in_RSI; local_418 != in_RDX;
      local_418 = (undefined1 (*) [32])(*local_418 + in_EDI)) {
    local_480 = local_428;
    for (local_470 = local_418; local_470 != local_418 + in_R8D; local_470 = local_470 + 1) {
      auVar3 = vpunpcklbw_avx2(*local_470,ZEXT1632(ZEXT816(0)));
      auVar1 = vpunpckhbw_avx2(*local_470,ZEXT1632(ZEXT816(0)));
      auVar4 = vpunpcklwd_avx2(auVar3,ZEXT1632(ZEXT816(0)));
      auVar3 = vpunpckhwd_avx2(auVar3,ZEXT1632(ZEXT816(0)));
      auVar5 = vpunpcklwd_avx2(auVar1,ZEXT1632(ZEXT816(0)));
      auVar2 = vpunpckhwd_avx2(auVar1,ZEXT1632(ZEXT816(0)));
      auVar1 = vpaddd_avx2(auVar4,*local_480);
      local_320 = auVar1._0_8_;
      uStack_318 = auVar1._8_8_;
      uStack_310 = auVar1._16_8_;
      uStack_308 = auVar1._24_8_;
      *(undefined8 *)*local_480 = local_320;
      *(undefined8 *)(*local_480 + 8) = uStack_318;
      *(undefined8 *)(*local_480 + 0x10) = uStack_310;
      *(undefined8 *)(*local_480 + 0x18) = uStack_308;
      auVar1 = vpaddd_avx2(auVar3,local_480[1]);
      local_360 = auVar1._0_8_;
      uStack_358 = auVar1._8_8_;
      uStack_350 = auVar1._16_8_;
      uStack_348 = auVar1._24_8_;
      *(undefined8 *)local_480[1] = local_360;
      *(undefined8 *)(local_480[1] + 8) = uStack_358;
      *(undefined8 *)(local_480[1] + 0x10) = uStack_350;
      *(undefined8 *)(local_480[1] + 0x18) = uStack_348;
      auVar1 = vpaddd_avx2(auVar5,local_480[2]);
      local_3a0 = auVar1._0_8_;
      uStack_398 = auVar1._8_8_;
      uStack_390 = auVar1._16_8_;
      uStack_388 = auVar1._24_8_;
      *(undefined8 *)local_480[2] = local_3a0;
      *(undefined8 *)(local_480[2] + 8) = uStack_398;
      *(undefined8 *)(local_480[2] + 0x10) = uStack_390;
      *(undefined8 *)(local_480[2] + 0x18) = uStack_388;
      auVar1 = vpaddd_avx2(auVar2,local_480[3]);
      local_3e0 = auVar1._0_8_;
      uStack_3d8 = auVar1._8_8_;
      uStack_3d0 = auVar1._16_8_;
      uStack_3c8 = auVar1._24_8_;
      *(undefined8 *)local_480[3] = local_3e0;
      *(undefined8 *)(local_480[3] + 8) = uStack_3d8;
      *(undefined8 *)(local_480[3] + 0x10) = uStack_3d0;
      *(undefined8 *)(local_480[3] + 0x18) = uStack_3c8;
      local_480 = local_480 + 4;
    }
    if ((uint)outX != 0) {
      local_568 = *local_418 + in_R9D;
      pbVar6 = local_568 + (uint)outX;
      local_578 = (int *)(*local_428 + (ulong)in_R9D * 4);
      for (; local_568 != pbVar6; local_568 = local_568 + 1) {
        *local_578 = (uint)*local_568 + *local_578;
        local_578 = local_578 + 1;
      }
    }
    local_428 = (undefined1 (*) [32])(*local_428 + (ulong)(in_R9D + (uint)outX) * 4);
  }
  return;
}

Assistant:

void Accumulate( uint32_t rowSize, const uint8_t * imageY, const uint8_t * imageYEnd, uint32_t * outY, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        simd zero = _mm256_setzero_si256();

        const uint32_t width = totalSimdWidth + nonSimdWidth;

        for( ; imageY != imageYEnd; imageY += rowSize, outY += width ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;
            simd       * dst    = reinterpret_cast <simd*> (outY);

            for( ; src != srcEnd; ++src ) {
                simd data = _mm256_loadu_si256( src );

                const simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                const simd dataHi  = _mm256_unpackhi_epi8( data, zero );

                const simd data_1 = _mm256_unpacklo_epi16( dataLo, zero );
                const simd data_2 = _mm256_unpackhi_epi16( dataLo, zero );
                const simd data_3 = _mm256_unpacklo_epi16( dataHi, zero );
                const simd data_4 = _mm256_unpackhi_epi16( dataHi, zero );

                _mm256_storeu_si256( dst, _mm256_add_epi32( data_1, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( data_2, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( data_3, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( data_4, _mm256_loadu_si256( dst ) ) );
                ++dst;
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;
                uint32_t      * outX      = outY + totalSimdWidth;

                for( ; imageX != imageXEnd; ++imageX, ++outX )
                    (*outX) += (*imageX);
            }   
        }
    }